

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  WebPMuxError WVar11;
  undefined4 extraout_var;
  WebPImageReader p_Var12;
  WebPAnimEncoder *pWVar13;
  WebPMux *mux;
  char **ppcVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  uint local_264;
  uint8_t *data;
  WebPAnimEncoder *local_258;
  char **local_250;
  char *local_248;
  ulong local_240;
  uint local_234;
  long local_230;
  uint local_224;
  int local_220;
  uint local_21c;
  uint32_t features;
  int local_20c;
  WebPData webp_data;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  CommandLineArguments cmd_args;
  WebPPicture pic;
  
  iVar4 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,&cmd_args);
  local_240 = CONCAT44(extraout_var,iVar4);
  if (iVar4 == 0) {
    return 1;
  }
  lVar16 = (long)cmd_args.argc_;
  local_250 = cmd_args.argv_;
  webp_data.bytes = (uint8_t *)0x0;
  webp_data.size = 0;
  iVar4 = WebPAnimEncoderOptionsInitInternal(&anim_config,0x109);
  if (((iVar4 == 0) ||
      (iVar4 = WebPConfigInitInternal(&config,WEBP_PRESET_DEFAULT,75.0,0x210), iVar4 == 0)) ||
     (iVar4 = WebPPictureInitInternal(&pic,0x210), iVar4 == 0)) {
    fwrite("Library version mismatch!\n",0x1a,1,stderr);
    pWVar13 = (WebPAnimEncoder *)0x0;
    uVar8 = 0;
    local_264 = 0;
    iVar4 = 0;
    pcVar17 = (char *)0x0;
  }
  else {
    local_248 = (char *)0x0;
    local_20c = 0;
    local_264 = 0;
    local_258 = (WebPAnimEncoder *)((ulong)local_258 & 0xffffffff00000000);
    ppcVar14 = local_250;
    local_230 = lVar16;
    for (iVar4 = 0; iVar4 < (int)lVar16; iVar4 = iVar4 + 1) {
      pcVar17 = ppcVar14[iVar4];
      if (*pcVar17 == '-') {
        data = (uint8_t *)((ulong)data & 0xffffffff00000000);
        cVar1 = *pcVar17;
        if (((cVar1 == '-') && (pcVar17[1] == 'o')) && (pcVar17[2] == '\0')) {
          iVar5 = iVar4 + 1;
          if ((int)local_230 <= iVar5) goto LAB_0010376f;
          ppcVar14[iVar4] = (char *)0x0;
          local_248 = ppcVar14[iVar5];
          iVar7 = local_20c;
          iVar4 = iVar5;
LAB_00103967:
          local_20c = iVar7;
          if ((int)data == 0) {
            local_250[iVar4] = (char *)0x0;
            local_240 = 1;
            ppcVar14 = local_250;
            lVar16 = local_230;
            goto LAB_0010398f;
          }
          iVar4 = 0;
        }
        else {
LAB_0010376f:
          iVar5 = strcmp(pcVar17,"-kmin");
          if (iVar5 == 0) {
            iVar5 = iVar4 + 1;
            if (iVar5 < (int)local_230) {
              local_250[iVar4] = (char *)0x0;
              anim_config.kmin = ExUtilGetInt(local_250[iVar5],0,(int *)&data);
              iVar7 = local_20c;
              iVar4 = iVar5;
              goto LAB_00103967;
            }
          }
          iVar5 = strcmp(pcVar17,"-kmax");
          if (iVar5 == 0) {
            iVar5 = iVar4 + 1;
            if (iVar5 < (int)local_230) {
              local_250[iVar4] = (char *)0x0;
              anim_config.kmax = ExUtilGetInt(local_250[iVar5],0,(int *)&data);
              iVar7 = local_20c;
              iVar4 = iVar5;
              goto LAB_00103967;
            }
          }
          iVar5 = strcmp(pcVar17,"-loop");
          if (iVar5 != 0) {
LAB_00103849:
            iVar5 = strcmp(pcVar17,"-min_size");
            if (iVar5 == 0) {
              anim_config.minimize_size = 1;
              iVar7 = local_20c;
            }
            else {
              iVar5 = strcmp(pcVar17,"-mixed");
              if (iVar5 == 0) {
                anim_config.allow_mixed = 1;
                config.lossless = 0;
                iVar7 = local_20c;
              }
              else {
                iVar5 = strcmp(pcVar17,"-near_lossless");
                if (iVar5 == 0) {
                  iVar5 = iVar4 + 1;
                  if (iVar5 < (int)local_230) {
                    local_250[iVar4] = (char *)0x0;
                    config.near_lossless = ExUtilGetInt(local_250[iVar5],0,(int *)&data);
                    iVar7 = local_20c;
                    iVar4 = iVar5;
                    goto LAB_00103967;
                  }
                }
                iVar5 = strcmp(pcVar17,"-sharp_yuv");
                if (iVar5 != 0) {
                  if (cVar1 == '-') {
                    if ((pcVar17[1] == 'v') && (iVar7 = 1, pcVar17[2] == '\0')) goto LAB_00103967;
                    if ((pcVar17[1] == 'h') && (pcVar17[2] == '\0')) goto LAB_00103ee0;
                  }
                  iVar5 = strcmp(pcVar17,"-help");
                  if (iVar5 == 0) {
LAB_00103ee0:
                    Help();
                    return 0;
                  }
                  iVar5 = strcmp(pcVar17,"-version");
                  ppcVar14 = local_250;
                  lVar16 = local_230;
                  if (iVar5 != 0) goto LAB_0010398f;
                  uVar8 = WebPGetEncoderVersion();
                  uVar9 = WebPGetMuxVersion();
                  uVar10 = SharpYuvGetVersion();
                  printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
                         (ulong)(uVar8 >> 0x10 & 0xff),(ulong)(uVar8 >> 8 & 0xff),
                         (ulong)(uVar8 & 0xff),(ulong)(uVar9 >> 0x10 & 0xff),
                         (ulong)(uVar9 >> 8 & 0xff),uVar9 & 0xff);
                  printf("libsharpyuv: %d.%d.%d\n",(ulong)(uVar10 >> 0x18),(ulong)(uVar10 >> 0x10),
                         (ulong)(uVar10 & 0xff));
                  iVar4 = (int)local_240;
                  goto LAB_00103dc3;
                }
                config.use_sharp_yuv = 1;
                iVar7 = local_20c;
              }
            }
            goto LAB_00103967;
          }
          iVar5 = iVar4 + 1;
          if ((int)local_230 <= iVar5) goto LAB_00103849;
          local_250[iVar4] = (char *)0x0;
          local_264 = ExUtilGetInt(local_250[iVar5],0,(int *)&data);
          iVar7 = local_20c;
          iVar4 = iVar5;
          if (-1 < (int)local_264) goto LAB_00103967;
          iVar4 = 0;
          fprintf(stderr,"Invalid non-positive loop-count (%d)\n",(ulong)local_264);
        }
LAB_00103dc3:
        uVar8 = 0;
        pWVar13 = (WebPAnimEncoder *)0x0;
        pcVar17 = local_248;
        goto LAB_00103fc4;
      }
      local_258 = (WebPAnimEncoder *)CONCAT44(local_258._4_4_,1);
LAB_0010398f:
    }
    if ((int)local_258 == 0) {
      fwrite("No input file(s) for generating animation!\n",0x2b,1,stderr);
      Help();
      pWVar13 = (WebPAnimEncoder *)0x0;
      uVar8 = 0;
      iVar4 = 0;
      pcVar17 = local_248;
    }
    else {
      config.lossless = 1;
      local_224 = 100;
      local_258 = (WebPAnimEncoder *)0x0;
      local_240 = local_240 & 0xffffffff00000000;
      local_234 = 0;
      local_21c = 0;
      local_220 = 0;
      iVar4 = 0;
      for (iVar5 = 0; iVar7 = (int)lVar16, iVar5 < iVar7; iVar5 = iVar5 + 1) {
        pcVar17 = ppcVar14[iVar5];
        if (pcVar17 != (char *)0x0) {
          if (*pcVar17 != '-') {
            iVar4 = WebPValidateConfig(&config);
            if (iVar4 == 0) {
              fwrite("Invalid configuration.\n",0x17,1,stderr);
LAB_00103fb1:
              uVar8 = (uint)local_240;
            }
            else {
              pic.use_argb = 1;
              data = (uint8_t *)0x0;
              _features = 0;
              iVar4 = ImgIoUtilReadFile(local_250[iVar5],&data,(size_t *)&features);
              if (iVar4 == 0) goto LAB_00103fb1;
              p_Var12 = WebPGuessImageReader(data,_features);
              iVar4 = (*p_Var12)(data,_features,&pic,1,(Metadata *)0x0);
              WebPFree(data);
              uVar3 = local_240;
              uVar8 = (uint)local_240;
              if (iVar4 != 0) {
                pWVar13 = local_258;
                if (local_258 == (WebPAnimEncoder *)0x0) {
                  local_21c = pic.width;
                  local_220 = pic.height;
                  pWVar13 = WebPAnimEncoderNewInternal(pic.width,pic.height,&anim_config,0x109);
                  if (pWVar13 != (WebPAnimEncoder *)0x0) goto LAB_00103b68;
                  fwrite("Could not create WebPAnimEncoder object.\n",0x29,1,stderr);
                  bVar2 = true;
                  local_258 = (WebPAnimEncoder *)0x0;
                }
                else {
LAB_00103b68:
                  local_258 = pWVar13;
                  if ((local_21c == pic.width) && (local_220 == pic.height)) {
                    iVar4 = WebPAnimEncoderAdd(pWVar13,&pic,local_234,&config);
                    if (iVar4 != 0) {
                      bVar2 = false;
                      goto LAB_00103bb4;
                    }
                    fprintf(stderr,"Error while adding frame #%d\n",uVar3 & 0xffffffff);
                  }
                  else {
                    fprintf(stderr,
                            "Frame #%d dimension mismatched! Got %d x %d. Was expecting %d x %d.\n",
                            uVar3 & 0xffffffff,(ulong)(uint)pic.width,(ulong)(uint)pic.height,
                            (ulong)local_21c,local_220);
                  }
                  bVar2 = true;
                }
LAB_00103bb4:
                WebPPictureFree(&pic);
                if (!bVar2) {
                  if (local_20c != 0) {
                    fprintf(stderr,"Added frame #%3d at time %4d (file: %s)\n",uVar3 & 0xffffffff,
                            (ulong)local_234);
                  }
                  local_234 = local_234 + local_224;
                  local_240 = CONCAT44(local_240._4_4_,uVar8 + 1);
                  ppcVar14 = local_250;
                  lVar16 = local_230;
                  iVar4 = iVar5;
                  goto LAB_00103ce6;
                }
              }
            }
            iVar4 = 0;
            pWVar13 = local_258;
            pcVar17 = local_248;
            goto LAB_00103fc4;
          }
          data = (uint8_t *)((ulong)data & 0xffffffff00000000);
          iVar6 = strcmp(pcVar17,"-lossy");
          if (iVar6 == 0) {
            if (anim_config.allow_mixed == 0) {
              config.lossless = 0;
            }
          }
          else {
            iVar6 = strcmp(pcVar17,"-lossless");
            if (iVar6 == 0) {
              if (anim_config.allow_mixed == 0) {
                config.lossless = 1;
              }
            }
            else if (*pcVar17 == '-') {
              if (((pcVar17[1] == 'q') && (pcVar17[2] == '\0')) && (iVar5 + 1 < iVar7)) {
                config.quality = ExUtilGetFloat(local_250[iVar5 + 1],(int *)&data);
              }
              else if (((pcVar17[1] == 'm') && (pcVar17[2] == '\0')) && (iVar5 + 1 < iVar7)) {
                config.method = ExUtilGetInt(local_250[iVar5 + 1],0,(int *)&data);
              }
              else {
                if (((pcVar17[1] != 'd') || (pcVar17[2] != '\0')) || (iVar7 <= iVar5 + 1))
                goto LAB_00103c97;
                local_224 = ExUtilGetInt(local_250[iVar5 + 1],0,(int *)&data);
                if ((int)local_224 < 1) {
                  fprintf(stderr,"Invalid negative duration (%d)\n",(ulong)local_224);
                  goto LAB_00103fb1;
                }
              }
              iVar5 = iVar5 + 1;
            }
            else {
LAB_00103c97:
              iVar7 = strcmp(pcVar17,"-exact");
              if (iVar7 == 0) {
                config.exact = 1;
              }
              else {
                iVar7 = strcmp(pcVar17,"-noexact");
                if (iVar7 == 0) {
                  config.exact = 0;
                }
                else {
                  data = (uint8_t *)CONCAT44(data._4_4_,1);
                  fprintf(stderr,"Unknown option [%s]\n",pcVar17);
                }
              }
            }
          }
          ppcVar14 = local_250;
          if ((int)data != 0) goto LAB_00103fb1;
        }
LAB_00103ce6:
      }
      lVar15 = (long)iVar4;
      uVar8 = (uint)local_240;
      while (pWVar13 = local_258, lVar15 = lVar15 + 1, lVar15 < lVar16) {
        if (ppcVar14[lVar15] != (char *)0x0) {
          fprintf(stderr,"Warning: unused option [%s]! Frame options go before the input frame.\n");
          ppcVar14 = local_250;
        }
      }
      iVar4 = 0;
      iVar5 = WebPAnimEncoderAdd(local_258,(WebPPicture *)0x0,local_234,(WebPConfig *)0x0);
      if ((iVar5 == 0) || (iVar5 = WebPAnimEncoderAssemble(pWVar13,&webp_data), iVar5 == 0)) {
        fwrite("Error during final animation assembly.\n",0x27,1,stderr);
        pcVar17 = local_248;
      }
      else {
        iVar4 = 1;
        pcVar17 = local_248;
      }
    }
  }
LAB_00103fc4:
  WebPAnimEncoderDelete(pWVar13);
  if ((iVar4 != 0) && (0 < (int)local_264)) {
    iVar4 = 1;
    mux = WebPMuxCreateInternal(&webp_data,1,0x109);
    if (mux != (WebPMux *)0x0) {
      WVar11 = WebPMuxGetFeatures(mux,&features);
      if (WVar11 != WEBP_MUX_OK) goto LAB_0010406f;
      if ((_features & 2) == 0) {
        WebPMuxDelete(mux);
        goto LAB_00104096;
      }
      WVar11 = WebPMuxGetAnimationParams(mux,(WebPMuxAnimParams *)&data);
      if (WVar11 == WEBP_MUX_OK) {
        data = (uint8_t *)CONCAT44(local_264,(int)data);
        WVar11 = WebPMuxSetAnimationParams(mux,(WebPMuxAnimParams *)&data);
        if (WVar11 != WEBP_MUX_OK) goto LAB_0010406f;
        WebPDataClear(&webp_data);
        WVar11 = WebPMuxAssemble(mux,&webp_data);
        WebPMuxDelete(mux);
        if (WVar11 == WEBP_MUX_OK) goto LAB_00104096;
      }
      else {
LAB_0010406f:
        WebPMuxDelete(mux);
      }
      fwrite("Error during loop-count setting\n",0x20,1,stderr);
    }
    iVar4 = 0;
  }
LAB_00104096:
  iVar5 = 1;
  if (iVar4 != 0) {
    if (pcVar17 == (char *)0x0) {
      fwrite("[no output file specified]   ",0x1d,1,stderr);
    }
    else {
      iVar4 = ImgIoUtilWriteFile(pcVar17,webp_data.bytes,webp_data.size);
      if (iVar4 == 0) goto LAB_001040b9;
      fprintf(stderr,"output file: %s     ",pcVar17);
    }
    iVar5 = 0;
    fprintf(stderr,"[%d frames, %u bytes].\n",(ulong)uVar8,webp_data.size & 0xffffffff);
  }
LAB_001040b9:
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  return iVar5;
}

Assistant:

int main(int argc, const char* argv[]) {
  const char* output = NULL;
  WebPAnimEncoder* enc = NULL;
  int verbose = 0;
  int pic_num = 0;
  int duration = 100;
  int timestamp_ms = 0;
  int loop_count = 0;
  int width = 0, height = 0;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  WebPPicture pic;
  WebPData webp_data;
  int c;
  int have_input = 0;
  int last_input_index = 0;
  CommandLineArguments cmd_args;
  int ok;

  INIT_WARGV(argc, argv);

  ok = ExUtilInitCommandLineArguments(argc - 1, argv + 1, &cmd_args);
  if (!ok) FREE_WARGV_AND_RETURN(EXIT_FAILURE);

  argc = cmd_args.argc_;
  argv = cmd_args.argv_;

  WebPDataInit(&webp_data);
  if (!WebPAnimEncoderOptionsInit(&anim_config) ||
      !WebPConfigInit(&config) ||
      !WebPPictureInit(&pic)) {
    fprintf(stderr, "Library version mismatch!\n");
    ok = 0;
    goto End;
  }

  // 1st pass of option parsing
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c][0] == '-') {
      int parse_error = 0;
      if (!strcmp(argv[c], "-o") && c + 1 < argc) {
        argv[c] = NULL;
        output = (const char*)GET_WARGV_SHIFTED(argv, ++c);
      } else if (!strcmp(argv[c], "-kmin") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmin = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-kmax") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmax = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-loop") && c + 1 < argc) {
        argv[c] = NULL;
        loop_count = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (loop_count < 0) {
          fprintf(stderr, "Invalid non-positive loop-count (%d)\n", loop_count);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-min_size")) {
        anim_config.minimize_size = 1;
      } else if (!strcmp(argv[c], "-mixed")) {
        anim_config.allow_mixed = 1;
        config.lossless = 0;
      } else if (!strcmp(argv[c], "-near_lossless") && c + 1 < argc) {
        argv[c] = NULL;
        config.near_lossless = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-sharp_yuv")) {
        config.use_sharp_yuv = 1;
      } else if (!strcmp(argv[c], "-v")) {
        verbose = 1;
      } else if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
        Help();
        FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
      } else if (!strcmp(argv[c], "-version")) {
        const int enc_version = WebPGetEncoderVersion();
        const int mux_version = WebPGetMuxVersion();
        const int sharpyuv_version = SharpYuvGetVersion();
        printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
               (enc_version >> 16) & 0xff, (enc_version >> 8) & 0xff,
               enc_version & 0xff, (mux_version >> 16) & 0xff,
               (mux_version >> 8) & 0xff, mux_version & 0xff);
        printf("libsharpyuv: %d.%d.%d\n", (sharpyuv_version >> 24) & 0xff,
               (sharpyuv_version >> 16) & 0xffff, sharpyuv_version & 0xff);
        goto End;
      } else {
        continue;
      }
      ok = !parse_error;
      if (!ok) goto End;
      argv[c] = NULL;   // mark option as 'parsed' during 1st pass
    } else {
      have_input |= 1;
    }
  }
  if (!have_input) {
    fprintf(stderr, "No input file(s) for generating animation!\n");
    ok = 0;
    Help();
    goto End;
  }

  // image-reading pass
  pic_num = 0;
  config.lossless = 1;
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c] == NULL) continue;
    if (argv[c][0] == '-') {    // parse local options
      int parse_error = 0;
      if (!strcmp(argv[c], "-lossy")) {
        if (!anim_config.allow_mixed) config.lossless = 0;
      } else if (!strcmp(argv[c], "-lossless")) {
        if (!anim_config.allow_mixed) config.lossless = 1;
      } else if (!strcmp(argv[c], "-q") && c + 1 < argc) {
        config.quality = ExUtilGetFloat(argv[++c], &parse_error);
      } else if (!strcmp(argv[c], "-m") && c + 1 < argc) {
        config.method = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-d") && c + 1 < argc) {
        duration = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (duration <= 0) {
          fprintf(stderr, "Invalid negative duration (%d)\n", duration);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-exact")) {
        config.exact = 1;
      } else if (!strcmp(argv[c], "-noexact")) {
        config.exact = 0;
      } else {
        parse_error = 1;   // shouldn't be here.
        fprintf(stderr, "Unknown option [%s]\n", argv[c]);
      }
      ok = !parse_error;
      if (!ok) goto End;
      continue;
    }

    if (ok) {
      ok = WebPValidateConfig(&config);
      if (!ok) {
        fprintf(stderr, "Invalid configuration.\n");
        goto End;
      }
    }

    // read next input image
    pic.use_argb = 1;
    ok = ReadImage((const char*)GET_WARGV_SHIFTED(argv, c), &pic);
    last_input_index = c;
    if (!ok) goto End;

    if (enc == NULL) {
      width  = pic.width;
      height = pic.height;
      enc = WebPAnimEncoderNew(width, height, &anim_config);
      ok = (enc != NULL);
      if (!ok) {
        fprintf(stderr, "Could not create WebPAnimEncoder object.\n");
      }
    }

    if (ok) {
      ok = (width == pic.width && height == pic.height);
      if (!ok) {
        fprintf(stderr, "Frame #%d dimension mismatched! "
                        "Got %d x %d. Was expecting %d x %d.\n",
                pic_num, pic.width, pic.height, width, height);
      }
    }

    if (ok) {
      ok = WebPAnimEncoderAdd(enc, &pic, timestamp_ms, &config);
      if (!ok) {
        fprintf(stderr, "Error while adding frame #%d\n", pic_num);
      }
    }
    WebPPictureFree(&pic);
    if (!ok) goto End;

    if (verbose) {
      WFPRINTF(stderr, "Added frame #%3d at time %4d (file: %s)\n",
               pic_num, timestamp_ms, GET_WARGV_SHIFTED(argv, c));
    }
    timestamp_ms += duration;
    ++pic_num;
  }

  for (c = last_input_index + 1; c < argc; ++c) {
    if (argv[c] != NULL) {
      fprintf(stderr, "Warning: unused option [%s]!"
                      " Frame options go before the input frame.\n", argv[c]);
    }
  }

  // add a last fake frame to signal the last duration
  ok = ok && WebPAnimEncoderAdd(enc, NULL, timestamp_ms, NULL);
  ok = ok && WebPAnimEncoderAssemble(enc, &webp_data);
  if (!ok) {
    fprintf(stderr, "Error during final animation assembly.\n");
  }

 End:
  // free resources
  WebPAnimEncoderDelete(enc);

  if (ok && loop_count > 0) {  // Re-mux to add loop count.
    ok = SetLoopCount(loop_count, &webp_data);
  }

  if (ok) {
    if (output != NULL) {
      ok = ImgIoUtilWriteFile(output, webp_data.bytes, webp_data.size);
      if (ok) WFPRINTF(stderr, "output file: %s     ", (const W_CHAR*)output);
    } else {
      fprintf(stderr, "[no output file specified]   ");
    }
  }

  if (ok) {
    fprintf(stderr, "[%d frames, %u bytes].\n",
            pic_num, (unsigned int)webp_data.size);
  }
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  FREE_WARGV_AND_RETURN(ok ? EXIT_SUCCESS : EXIT_FAILURE);
}